

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall
duckdb::DBConfig::ResetOption(DBConfig *this,DatabaseInstance *db,ConfigurationOption *option)

{
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::mutex::lock(&this->config_lock);
  if (option->reset_global != (reset_global_function_t)0x0) {
    (*option->reset_global)(db,this);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Could not reset option \"%s\" as a global option",&local_41);
  InternalException::InternalException<char_const*>(this_00,&local_40,option->name);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::ResetOption(DatabaseInstance *db, const ConfigurationOption &option) {
	lock_guard<mutex> l(config_lock);
	if (!option.reset_global) {
		throw InternalException("Could not reset option \"%s\" as a global option", option.name);
	}
	D_ASSERT(option.set_global);
	option.reset_global(db, *this);
}